

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_write.cpp
# Opt level: O1

string * SighashToStr_abi_cxx11_(string *__return_storage_ptr__,uchar sighash_type)

{
  long lVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  long lVar4;
  undefined7 in_register_00000031;
  _Base_ptr p_Var5;
  string *psVar6;
  long in_FS_OFFSET;
  bool bVar7;
  
  p_Var5 = (_Base_ptr)CONCAT71(in_register_00000031,sighash_type);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var2 = &mapSigHashTypes_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
  psVar6 = __return_storage_ptr__;
  if (mapSigHashTypes_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
      (_Base_ptr)0x0) {
    p_Var2 = &mapSigHashTypes_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var3 = mapSigHashTypes_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      bVar7 = (byte)(char)p_Var3[1]._M_color < sighash_type;
      psVar6 = (string *)(ulong)bVar7;
      if (!bVar7) {
        p_Var2 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[(long)psVar6];
    } while (p_Var3 != (_Base_ptr)0x0);
  }
  p_Var3 = &mapSigHashTypes_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
  if (((_Rb_tree_header *)p_Var2 != &mapSigHashTypes_abi_cxx11_._M_t._M_impl.super__Rb_tree_header)
     && (p_Var3 = &mapSigHashTypes_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header,
        (byte)(char)p_Var2[1]._M_color <= sighash_type)) {
    p_Var3 = p_Var2;
  }
  if ((_Rb_tree_header *)p_Var3 == &mapSigHashTypes_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    lVar4 = 0x6d3da0;
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_0034e67b;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    p_Var5 = p_Var3[1]._M_parent;
    lVar4 = (long)&p_Var5->_M_color + (long)&(p_Var3[1]._M_left)->_M_color;
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
LAB_0034e67b:
      __stack_chk_fail(psVar6,p_Var5,lVar4);
    }
    std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SighashToStr(unsigned char sighash_type)
{
    const auto& it = mapSigHashTypes.find(sighash_type);
    if (it == mapSigHashTypes.end()) return "";
    return it->second;
}